

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O1

void __thiscall QSslServerPrivate::removeSocketData(QSslServerPrivate *this,quintptr socket)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  iterator it;
  quintptr local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = socket;
  it = QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::findImpl<unsigned_long_long>
                 (&this->socketData,&local_28);
  if (it.i.d != (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)0x0
      || it.i.bucket != 0) {
    pSVar1 = (it.i.d)->spans;
    uVar2 = it.i.bucket >> 7;
    SocketData::disconnectSignals
              ((SocketData *)
               (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)it.i.bucket & 0x7f]].storage.data
               + 8));
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::erase
              (&this->socketData,(const_iterator)it.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::removeSocketData(quintptr socket)
{
    auto it = socketData.find(socket);
    if (it != socketData.end()) {
        it->disconnectSignals();
        socketData.erase(it);
    }
}